

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glyphs.h
# Opt level: O0

void __thiscall rengine::GlyphContext::GlyphContext(GlyphContext *this,string *fontFile)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  int iVar3;
  ostream *poVar4;
  streamoff sVar5;
  uchar *puVar6;
  string local_2a8 [32];
  string local_288 [32];
  undefined1 local_268 [16];
  int local_258;
  undefined4 local_254;
  int size;
  char local_220 [8];
  ifstream file;
  string *fontFile_local;
  GlyphContext *this_local;
  
  this->m_fontData = (uchar *)0x0;
  _Var2 = std::operator|(_S_bin,_S_in);
  _Var2 = std::operator|(_Var2,_S_ate);
  std::ifstream::ifstream(local_220,(string *)fontFile,_Var2);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"E [");
    log_timestring_abi_cxx11_();
    poVar4 = std::operator<<(poVar4,(string *)&size);
    poVar4 = std::operator<<(poVar4,"]: ");
    poVar4 = std::operator<<(poVar4,"rengine::GlyphContext::GlyphContext(const std::string &)");
    poVar4 = std::operator<<(poVar4,": ");
    poVar4 = std::operator<<(poVar4,"Failed to open font file \'");
    poVar4 = std::operator<<(poVar4,(string *)fontFile);
    poVar4 = std::operator<<(poVar4,"\'");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&size);
    local_254 = 1;
  }
  else {
    local_268 = std::istream::tellg();
    sVar5 = std::fpos::operator_cast_to_long((fpos *)local_268);
    local_258 = (int)sVar5;
    puVar6 = (uchar *)malloc((long)local_258);
    this->m_fontData = puVar6;
    if (this->m_fontData == (uchar *)0x0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"E [");
      log_timestring_abi_cxx11_();
      poVar4 = std::operator<<(poVar4,local_288);
      poVar4 = std::operator<<(poVar4,"]: ");
      poVar4 = std::operator<<(poVar4,"rengine::GlyphContext::GlyphContext(const std::string &)");
      poVar4 = std::operator<<(poVar4,": ");
      poVar4 = std::operator<<(poVar4,"Failed to allocate font data for \'");
      poVar4 = std::operator<<(poVar4,(string *)fontFile);
      poVar4 = std::operator<<(poVar4,"\'");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_288);
      local_254 = 1;
    }
    else {
      std::istream::seekg((long)local_220,_S_beg);
      std::istream::read(local_220,(long)this->m_fontData);
      std::ifstream::close();
      iVar3 = stbtt_InitFont(&this->m_fontInfo,this->m_fontData,0);
      if (iVar3 == 0) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"E [");
        log_timestring_abi_cxx11_();
        poVar4 = std::operator<<(poVar4,local_2a8);
        poVar4 = std::operator<<(poVar4,"]: ");
        poVar4 = std::operator<<(poVar4,"rengine::GlyphContext::GlyphContext(const std::string &)");
        poVar4 = std::operator<<(poVar4,": ");
        poVar4 = std::operator<<(poVar4,"Failed to initialize font \'");
        poVar4 = std::operator<<(poVar4,(string *)fontFile);
        poVar4 = std::operator<<(poVar4,"\'");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_2a8);
        free(this->m_fontData);
        this->m_fontData = (uchar *)0x0;
        local_254 = 1;
      }
      else {
        local_254 = 0;
      }
    }
  }
  std::ifstream::~ifstream(local_220);
  return;
}

Assistant:

inline GlyphContext::GlyphContext(const std::string &fontFile)
{
    std::ifstream file(fontFile, std::ios::binary | std::ios::in | std::ios::ate);
    if (!file.is_open()) {
        loge << "Failed to open font file '" << fontFile << "'" << std::endl;
        return;
    }

    int size = file.tellg();

    m_fontData = (unsigned char *) malloc(size);
    if (!m_fontData) {
        loge << "Failed to allocate font data for '" << fontFile << "'" << std::endl;
        return;
    }

    file.seekg(0, std::ios::beg);
    file.read((char *) m_fontData, size);
    file.close();

    if (!stbtt_InitFont(&m_fontInfo, m_fontData, 0)) {
        loge << "Failed to initialize font '" << fontFile << "'" << std::endl;
        free(m_fontData);
        m_fontData = 0;
        return;
    }
}